

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
          (ImageBindingRenderCase *this,Context *context,char *name,char *desc,ShaderType shaderType
          ,TestType testType,GLenum imageType,GLenum textureType)

{
  allocator<char> local_51;
  string local_50;
  TestType local_30;
  ShaderType local_2c;
  TestType testType_local;
  ShaderType shaderType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ImageBindingRenderCase *this_local;
  
  local_30 = testType;
  local_2c = shaderType;
  _testType_local = desc;
  desc_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_image",&local_51);
  LayoutBindingRenderCase::LayoutBindingRenderCase
            (&this->super_LayoutBindingRenderCase,context,name,desc,shaderType,testType,0x8f38,
             0x90ca,0x90ce,0x90cf,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__ImageBindingRenderCase_011c1628;
  this->m_imageType = imageType;
  this->m_textureType = textureType;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_textures);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_textureColors);
  return;
}

Assistant:

ImageBindingRenderCase::ImageBindingRenderCase (Context&		context,
												const char*		name,
												const char*		desc,
												ShaderType		shaderType,
												TestType		testType,
												glw::GLenum		imageType,
												glw::GLenum		textureType)
	: LayoutBindingRenderCase		(context, name, desc, shaderType, testType, GL_MAX_IMAGE_UNITS, GL_MAX_VERTEX_IMAGE_UNIFORMS, GL_MAX_FRAGMENT_IMAGE_UNIFORMS, GL_MAX_COMBINED_IMAGE_UNIFORMS, "u_image")
	, m_imageType					(imageType)
	, m_textureType					(textureType)
{
}